

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

double ImPlot::PlotHistogram2D<long_long>
                 (char *label_id,longlong *xs,longlong *ys,int count,int x_bins,int y_bins,
                 bool density,ImPlotLimits range,bool outliers)

{
  ImVector<double> *this;
  TransformerLinLin transformer;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int cols;
  longlong *plVar5;
  bool bVar6;
  double *pdVar7;
  ImDrawList *DrawList;
  uint uVar8;
  ImPlotLimits *max_out;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int b;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double local_f8;
  int local_e0;
  int x_bins_local;
  ImPlotContext *local_d0;
  double local_c8;
  longlong *local_c0;
  longlong Min;
  double local_b0;
  int local_a8;
  int y_bins_local;
  ulong local_a0;
  longlong Max;
  double local_90;
  double height;
  double width;
  char *local_78;
  longlong *local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  ImPlotLimits *range_00;
  
  max_out = (ImPlotLimits *)(ulong)CONCAT31((int3)((uint)count >> 8),x_bins == 0);
  uVar14 = 0;
  uVar16 = 0;
  if ((y_bins != 0 && x_bins != 0) && 0 < count) {
    uVar12 = (ulong)(uint)y_bins;
    x_bins_local = x_bins;
    local_c0 = xs;
    y_bins_local = y_bins;
    local_78 = label_id;
    if ((((range.X.Min == 0.0) && (!NAN(range.X.Min))) && (range.X.Max == 0.0)) &&
       (!NAN(range.X.Max))) {
      max_out = (ImPlotLimits *)&Max;
      ImMinMaxArray<long_long>(xs,count,&Min,(longlong *)max_out);
      range.X.Min = (double)Min;
      range.X.Max = (double)Max;
    }
    dVar2 = range.X.Max;
    dVar1 = range.X.Min;
    if (((range.Y.Min == 0.0) && (!NAN(range.Y.Min))) &&
       ((range.Y.Max == 0.0 && (!NAN(range.Y.Max))))) {
      max_out = (ImPlotLimits *)&Max;
      ImMinMaxArray<long_long>(ys,count,&Min,(longlong *)max_out);
      range.Y.Min = (double)Min;
      range.Y.Max = (double)Max;
    }
    dVar4 = range.Y.Max;
    dVar3 = range.Y.Min;
    range_00 = &range;
    if (x_bins < 0) {
      CalculateBins<long_long>(local_c0,count,x_bins,&range_00->X,&x_bins_local,&width);
    }
    else {
      width = (dVar2 - dVar1) / (double)x_bins;
      range_00 = max_out;
    }
    if (y_bins < 0) {
      range_00 = (ImPlotLimits *)&range.Y;
      CalculateBins<long_long>(ys,count,y_bins,(ImPlotRange *)range_00,&y_bins_local,&height);
      uVar12 = (ulong)(uint)y_bins_local;
    }
    else {
      height = (dVar4 - dVar3) / (double)y_bins;
    }
    cols = x_bins_local;
    iVar10 = (int)uVar12 * x_bins_local;
    local_d0 = GImPlot;
    this = &GImPlot->Temp1;
    ImVector<double>::resize(this,iVar10);
    iVar13 = 0;
    if (iVar10 < 1) {
      iVar10 = iVar13;
    }
    for (; plVar5 = local_c0, iVar10 != iVar13; iVar13 = iVar13 + 1) {
      pdVar7 = ImVector<double>::operator[](this,iVar13);
      *pdVar7 = 0.0;
    }
    iVar13 = (int)uVar12 + -1;
    local_68 = height;
    uStack_60 = 0;
    local_58 = width;
    uStack_50 = 0;
    local_48 = height;
    dStack_40 = width;
    uVar11 = 0;
    uVar14 = 0;
    uVar16 = 0;
    local_c8 = 1.0;
    local_e0 = 0;
    local_a8 = count;
    local_a0 = uVar12;
    local_70 = ys;
    while( true ) {
      uVar12 = local_a0;
      local_f8 = (double)CONCAT44(uVar16,uVar14);
      if ((uint)count == uVar11) break;
      bVar6 = ImPlotLimits::Contains(&range,(double)plVar5[uVar11],(double)ys[uVar11]);
      if (bVar6) {
        auVar18._0_8_ = (double)ys[uVar11] - range.Y.Min;
        auVar18._8_8_ = (double)plVar5[uVar11] - range.X.Min;
        auVar19._8_8_ = dStack_40;
        auVar19._0_8_ = local_48;
        auVar19 = divpd(auVar18,auVar19);
        iVar15 = (int)auVar19._0_8_;
        iVar17 = (int)auVar19._8_8_;
        iVar9 = iVar17;
        if (cols + -1 <= iVar17) {
          iVar9 = cols + -1;
        }
        auVar20._4_4_ = iVar15;
        auVar20._0_4_ = iVar15;
        auVar20._8_4_ = iVar17;
        auVar20._12_4_ = iVar17;
        uVar8 = movmskpd((int)range_00,auVar20);
        range_00 = (ImPlotLimits *)(ulong)uVar8;
        iVar17 = 0;
        if ((uVar8 & 2) == 0) {
          iVar17 = iVar9;
        }
        if (iVar13 <= iVar15) {
          iVar15 = iVar13;
        }
        iVar9 = 0;
        if ((uVar8 & 1) == 0) {
          iVar9 = iVar15;
        }
        iVar17 = iVar9 * cols + iVar17;
        pdVar7 = ImVector<double>::operator[](this,iVar17);
        *pdVar7 = *pdVar7 + 1.0;
        pdVar7 = ImVector<double>::operator[](this,iVar17);
        if (local_f8 < *pdVar7) {
          pdVar7 = ImVector<double>::operator[](this,iVar17);
          uVar14 = SUB84(*pdVar7,0);
          uVar16 = (undefined4)((ulong)*pdVar7 >> 0x20);
        }
        local_e0 = local_e0 + 1;
      }
      uVar11 = uVar11 + 1;
    }
    if (density) {
      if (outliers) {
        local_e0 = local_a8;
      }
      local_c8 = local_c8 / (local_58 * (double)local_e0 * local_68);
      for (iVar13 = 0; iVar10 != iVar13; iVar13 = iVar13 + 1) {
        pdVar7 = ImVector<double>::operator[](this,iVar13);
        *pdVar7 = *pdVar7 * local_c8;
      }
      local_f8 = local_f8 * local_c8;
    }
    iVar10 = (int)uVar12;
    bVar6 = BeginItem(local_78,-1);
    if (bVar6) {
      if (GImPlot->FitThisFrame == true) {
        Min = (longlong)range.X.Min;
        local_b0 = range.Y.Min;
        FitPoint((ImPlotPoint *)&Min);
        Min = (longlong)range.X.Max;
        local_b0 = range.Y.Max;
        FitPoint((ImPlotPoint *)&Min);
      }
      DrawList = GetPlotDrawList();
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[transformer.YAxis]) {
      case 0:
        Min = (longlong)range.X.Min;
        local_b0 = range.Y.Min;
        Max = (longlong)range.X.Max;
        local_90 = range.Y.Max;
        RenderHeatmap<double,ImPlot::TransformerLinLin>
                  (transformer,DrawList,(local_d0->Temp1).Data,iVar10,cols,0.0,local_f8,(char *)0x0,
                   (ImPlotPoint *)&Min,(ImPlotPoint *)&Max,false);
        break;
      case 1:
        Min = (longlong)range.X.Min;
        local_b0 = range.Y.Min;
        Max = (longlong)range.X.Max;
        local_90 = range.Y.Max;
        RenderHeatmap<double,ImPlot::TransformerLogLin>
                  ((TransformerLogLin)transformer.YAxis,DrawList,(local_d0->Temp1).Data,iVar10,cols,
                   0.0,local_f8,(char *)0x0,(ImPlotPoint *)&Min,(ImPlotPoint *)&Max,false);
        break;
      case 2:
        Min = (longlong)range.X.Min;
        local_b0 = range.Y.Min;
        Max = (longlong)range.X.Max;
        local_90 = range.Y.Max;
        RenderHeatmap<double,ImPlot::TransformerLinLog>
                  ((TransformerLinLog)transformer.YAxis,DrawList,(local_d0->Temp1).Data,iVar10,cols,
                   0.0,local_f8,(char *)0x0,(ImPlotPoint *)&Min,(ImPlotPoint *)&Max,false);
        break;
      case 3:
        Min = (longlong)range.X.Min;
        local_b0 = range.Y.Min;
        Max = (longlong)range.X.Max;
        local_90 = range.Y.Max;
        RenderHeatmap<double,ImPlot::TransformerLogLog>
                  ((TransformerLogLog)transformer.YAxis,DrawList,(local_d0->Temp1).Data,iVar10,cols,
                   0.0,local_f8,(char *)0x0,(ImPlotPoint *)&Min,(ImPlotPoint *)&Max,false);
      }
      EndItem();
    }
    uVar14 = SUB84(local_f8,0);
    uVar16 = (undefined4)((ulong)local_f8 >> 0x20);
  }
  return (double)CONCAT44(uVar16,uVar14);
}

Assistant:

double PlotHistogram2D(const char* label_id, const T* xs, const T* ys, int count, int x_bins, int y_bins, bool density, ImPlotLimits range, bool outliers) {

    if (count <= 0 || x_bins == 0 || y_bins == 0)
        return 0;

    if (range.X.Min == 0 && range.X.Max == 0) {
        T Min, Max;
        ImMinMaxArray(xs, count, &Min, &Max);
        range.X.Min = (double)Min;
        range.X.Max = (double)Max;
    }
    if (range.Y.Min == 0 && range.Y.Max == 0) {
        T Min, Max;
        ImMinMaxArray(ys, count, &Min, &Max);
        range.Y.Min = (double)Min;
        range.Y.Max = (double)Max;
    }

    double width, height;
    if (x_bins < 0)
        CalculateBins(xs, count, x_bins, range.X, x_bins, width);
    else
        width = range.X.Size() / x_bins;
    if (y_bins < 0)
        CalculateBins(ys, count, y_bins, range.Y, y_bins, height);
    else
        height = range.Y.Size() / y_bins;

    const int bins = x_bins * y_bins;

    ImVector<double>& bin_counts = GImPlot->Temp1;
    bin_counts.resize(bins);

    for (int b = 0; b < bins; ++b)
        bin_counts[b] = 0;

    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        if (range.Contains((double)xs[i], (double)ys[i])) {
            const int xb = ImClamp( (int)((double)(xs[i] - range.X.Min) / width)  , 0, x_bins - 1);
            const int yb = ImClamp( (int)((double)(ys[i] - range.Y.Min) / height) , 0, y_bins - 1);
            const int b  = yb * x_bins + xb;
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
    }
    if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width * height);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }

    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(range.Min());
            FitPoint(range.Max());
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
        }
        EndItem();
    }
    return max_count;
}